

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkSpirVProgram.hpp
# Opt level: O2

SpirVAsmSource * vk::operator<<(SpirVAsmSource *src,char (*val) [6486])

{
  string local_30;
  
  de::toString<char[6486]>(&local_30,val);
  std::__cxx11::string::append((string *)src);
  std::__cxx11::string::~string((string *)&local_30);
  return src;
}

Assistant:

SpirVAsmSource& operator<< (SpirVAsmSource& src, const T& val)
{
	src.source += de::toString(val);
	return src;
}